

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::
print<std::back_insert_iterator<std::__cxx11::string>>
          (RMatrixLimited *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  SpinGroup *pSVar1;
  SpinGroup *spingroup;
  SpinGroup *this_00;
  ControlRecord local_60;
  
  local_60.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)(byte)*this;
  local_60.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)*(int *)(this + 4);
  local_60.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (*(long *)(this + 0x58) - *(long *)(this + 0x50)) / 0xa8 & 0xffffffff;
  local_60.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl._1_7_ = 0;
  local_60.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl._0_1_ = this[1];
  local_60.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 0.0;
  local_60.
  super_Base<njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Real,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
  .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>(&local_60,it,MAT,MF,MT);
  ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ListRecord *)(this + 8),it,MAT,MF,MT);
  pSVar1 = *(SpinGroup **)(this + 0x58);
  for (this_00 = *(SpinGroup **)(this + 0x50); this_00 != pSVar1; this_00 = this_00 + 0xa8) {
    SpinGroup::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  ControlRecord( 0.0, 0.0,
                 this->IFG(), this->KRM(),
                 this->NJS(), this->KRL() ).print( it, MAT, MF, MT );
  this->particle_pairs_.print( it, MAT, MF, MT );
  for ( const auto& spingroup : this->spin_groups_ ) {

    spingroup.print( it, MAT, MF, MT );
  }
}